

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfoDictionary.cpp
# Opt level: O3

PDFTextString * __thiscall
InfoDictionary::GetAdditionalInfoEntry
          (PDFTextString *__return_storage_ptr__,InfoDictionary *this,string *inKey)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  iterator iVar2;
  _Base_ptr p_Var3;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PDFTextString>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PDFTextString>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PDFTextString>_>_>
          ::find(&(this->mAdditionalInfoEntries)._M_t,inKey);
  paVar1 = &(__return_storage_ptr__->mTextString).field_2;
  if ((_Rb_tree_header *)iVar2._M_node ==
      &(this->mAdditionalInfoEntries)._M_t._M_impl.super__Rb_tree_header) {
    p_Var3 = (_Base_ptr)PDFTextString::Empty();
    (__return_storage_ptr__->mTextString)._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    p_Var3 = iVar2._M_node + 2;
    (__return_storage_ptr__->mTextString)._M_dataplus._M_p = (pointer)paVar1;
  }
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,*(long *)p_Var3,
             (long)&p_Var3->_M_parent->_M_color + *(long *)p_Var3);
  return __return_storage_ptr__;
}

Assistant:

PDFTextString InfoDictionary::GetAdditionalInfoEntry(const std::string& inKey)
{
	StringToPDFTextString::iterator it = mAdditionalInfoEntries.find(inKey);

	if(it == mAdditionalInfoEntries.end())
		return PDFTextString::Empty();
	else
		return it->second;
}